

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O0

void inproc_pipe_send(void *arg,nni_aio *aio)

{
  inproc_queue *queue_00;
  _Bool _Var1;
  inproc_queue *queue;
  inproc_pipe *pipe;
  nni_aio *aio_local;
  void *arg_local;
  
  queue_00 = *(inproc_queue **)((long)arg + 0x18);
  nni_aio_reset(aio);
  nni_mtx_lock(&queue_00->lock);
  _Var1 = nni_aio_start(aio,inproc_queue_cancel,queue_00);
  if (_Var1) {
    nni_aio_list_append(&queue_00->writers,aio);
    inproc_queue_run(queue_00);
    nni_mtx_unlock(&queue_00->lock);
  }
  else {
    nni_mtx_unlock(&queue_00->lock);
  }
  return;
}

Assistant:

static void
inproc_pipe_send(void *arg, nni_aio *aio)
{
	inproc_pipe  *pipe  = arg;
	inproc_queue *queue = pipe->send_queue;

	nni_aio_reset(aio);

	nni_mtx_lock(&queue->lock);
	if (!nni_aio_start(aio, inproc_queue_cancel, queue)) {
		nni_mtx_unlock(&queue->lock);
		return;
	}
	nni_aio_list_append(&queue->writers, aio);
	inproc_queue_run(queue);
	nni_mtx_unlock(&queue->lock);
}